

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O2

void __thiscall
baryonyx::itm::
solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
::solver_inequalities_01coeff
          (solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  pointer pmVar1;
  bound_factor *pbVar2;
  pointer pfVar3;
  pointer pfVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  pointer pfVar9;
  
  (this->super_debug_logger<false>).ofs = (FILE *)0x0;
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  std::make_unique<float[]>((size_t)&this->P);
  compute_reduced_costs_vector_size(csts);
  std::
  make_unique<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data[]>
            ((size_t)&this->R);
  std::
  make_unique<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::bound_factor[]>
            ((size_t)&this->b);
  std::make_unique<float[]>((size_t)&this->pi);
  uVar6 = 0;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  pmVar1 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>::bound_factor_*,_false>
           ._M_head_impl;
  do {
    if (uVar6 == (uint)m_) {
      return;
    }
    pfVar3 = *(pointer *)
              &pmVar1[uVar6].elements.
               super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ._M_impl;
    pfVar4 = *(pointer *)
              ((long)&pmVar1[uVar6].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    pfVar9 = pfVar3;
    while (pfVar9 != pfVar4) {
      piVar5 = &pfVar9->factor;
      pfVar9 = pfVar9 + 1;
      if (*piVar5 != 1) {
        details::fail_fast("Postcondition","cst.factor == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-01.cpp"
                           ,"94");
      }
    }
    uVar8 = pmVar1[uVar6].min;
    if (uVar8 == pmVar1[uVar6].max) {
      pbVar2[uVar6].min = uVar8;
      uVar7 = uVar8;
    }
    else {
      uVar8 = ~((int)uVar8 >> 0x1f) & uVar8;
      pbVar2[uVar6].min = uVar8;
      uVar7 = (uint)((ulong)((long)pfVar4 - (long)pfVar3) >> 3);
      if (pmVar1[uVar6].max < (int)uVar7) {
        uVar7 = pmVar1[uVar6].max;
      }
    }
    pbVar2[uVar6].max = uVar7;
    uVar6 = uVar6 + 1;
  } while ((int)uVar8 <= (int)uVar7);
  details::fail_fast("Postcondition","b[i].min <= b[i].max",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-01.cpp"
                     ,"105");
}

Assistant:

solver_inequalities_01coeff(random_engine& rng_,
                                int m_,
                                int n_,
                                const cost_type& c_,
                                const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_01coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        for (int i = 0; i != m; ++i) {
#if !defined(BARYONYX_FULL_OPTIMIZATION)
            // mscv 15.9.6 fail to build this line:
            // for ([[maybe_unused]] const auto& cst : csts[i].elements)
            //    bx_ensures(cst.factor == 1);
            for (const auto& cst : csts[i].elements)
                bx_ensures(cst.factor == 1);
#endif

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(0, csts[i].min);
                b[i].max = std::min(length(csts[i].elements), csts[i].max);
            }

            bx_ensures(b[i].min <= b[i].max);
        }
    }